

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeSIMDLoadStoreLane
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,SIMDLoadStoreLaneOp op,
          Address offset,uint align,uint8_t lane,Name mem)

{
  __index_type *this_00;
  SIMDLoadStoreLane *expr;
  bool bVar1;
  Ok local_109;
  size_t local_108;
  char *local_100;
  Address local_f8;
  Address local_f0;
  uint local_e4;
  Err local_e0;
  Err *local_b0;
  Err *err;
  Result<wasm::Ok> _val;
  SIMDLoadStoreLane curr;
  uint8_t lane_local;
  uint align_local;
  SIMDLoadStoreLaneOp op_local;
  IRBuilder *this_local;
  Address offset_local;
  
  this_00 = &_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index;
  curr.memory.super_IString.str._M_str._7_1_ = lane;
  SIMDLoadStoreLane::SIMDLoadStoreLane((SIMDLoadStoreLane *)this_00);
  wasm::Name::operator=((Name *)&curr.vec,&mem);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitSIMDLoadStoreLane
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,
             (SIMDLoadStoreLane *)this_00);
  local_b0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar1 = local_b0 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_e0,local_b0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_e0);
    wasm::Err::~Err(&local_e0);
  }
  local_e4 = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_e4 == 0) {
    local_f0.addr = offset.addr;
    wasm::Address::Address(&local_f8,(ulong)align);
    local_108 = mem.super_IString.str._M_len;
    local_100 = mem.super_IString.str._M_str;
    expr = Builder::makeSIMDLoadStoreLane
                     (&this->builder,op,local_f0,local_f8,curr.memory.super_IString.str._M_str._7_1_
                      ,(Expression *)curr._40_8_,curr.ptr,mem);
    push(this,(Expression *)expr);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_109);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeSIMDLoadStoreLane(SIMDLoadStoreLaneOp op,
                                          Address offset,
                                          unsigned align,
                                          uint8_t lane,
                                          Name mem) {
  SIMDLoadStoreLane curr;
  curr.memory = mem;
  CHECK_ERR(visitSIMDLoadStoreLane(&curr));
  push(builder.makeSIMDLoadStoreLane(
    op, offset, align, lane, curr.ptr, curr.vec, mem));
  return Ok{};
}